

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int bmi2)

{
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  HUF_CElt *in_R8;
  int in_R9D;
  undefined8 local_8;
  
  if (in_R9D == 0) {
    local_8 = HUF_compress1X_usingCTable_internal_default(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  else {
    local_8 = HUF_compress1X_usingCTable_internal_bmi2(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_8;
}

Assistant:

static size_t
HUF_compress1X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, const int bmi2)
{
    if (bmi2) {
        return HUF_compress1X_usingCTable_internal_bmi2(dst, dstSize, src, srcSize, CTable);
    }
    return HUF_compress1X_usingCTable_internal_default(dst, dstSize, src, srcSize, CTable);
}